

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O3

size_t __thiscall bssl::SSLAEADContext::MaxSealInputLen(SSLAEADContext *this,size_t max_out)

{
  uint32_t uVar1;
  int iVar2;
  EVP_AEAD *aead;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  
  uVar4 = (ulong)this->variable_nonce_len_;
  if ((this->field_0x26a & 1) == 0) {
    uVar4 = 0;
  }
  uVar6 = max_out - uVar4;
  sVar5 = 0;
  if ((uVar4 <= max_out && uVar6 != 0) && (sVar5 = uVar6, this->cipher_ != (SSL_CIPHER *)0x0)) {
    aead = EVP_AEAD_CTX_aead(&(this->ctx_).ctx_);
    sVar3 = EVP_AEAD_max_overhead(aead);
    iVar2 = SSL_CIPHER_is_block_cipher(this->cipher_);
    if (iVar2 != 0) {
      uVar1 = this->cipher_->algorithm_enc;
      uVar4 = 0x10;
      if ((uVar1 != 4) && (uVar1 != 2)) {
        if (uVar1 != 1) {
          abort();
        }
        uVar4 = 8;
      }
      if (sVar3 < uVar4 || sVar3 - uVar4 == 0) {
        __assert_fail("overhead > block_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0xc9,"size_t bssl::SSLAEADContext::MaxSealInputLen(size_t) const");
      }
      uVar6 = uVar6 & -uVar4;
      sVar3 = (sVar3 - uVar4) + 1;
    }
    sVar5 = 0;
    if (sVar3 <= uVar6) {
      sVar5 = uVar6 - sVar3;
    }
  }
  return sVar5;
}

Assistant:

size_t SSLAEADContext::MaxSealInputLen(size_t max_out) const {
  size_t explicit_nonce_len = ExplicitNonceLen();
  if (max_out <= explicit_nonce_len) {
    return 0;
  }
  max_out -= explicit_nonce_len;
  if (is_null_cipher() || CRYPTO_fuzzer_mode_enabled()) {
    return max_out;
  }
  // TODO(crbug.com/42290602): This should be part of |EVP_AEAD_CTX|.
  size_t overhead = EVP_AEAD_max_overhead(EVP_AEAD_CTX_aead(ctx_.get()));
  if (SSL_CIPHER_is_block_cipher(cipher())) {
    size_t block_size;
    switch (cipher()->algorithm_enc) {
      case SSL_AES128:
      case SSL_AES256:
        block_size = 16;
        break;
      case SSL_3DES:
        block_size = 8;
        break;
      default:
        abort();
    }

    // The output for a CBC cipher is always a whole number of blocks. Round the
    // remaining capacity down.
    max_out &= ~(block_size - 1);
    // The maximum overhead is a full block of padding and the MAC, but the
    // minimum overhead is one byte of padding, once we know the output is
    // rounded down.
    assert(overhead > block_size);
    overhead -= block_size - 1;
  }
  return max_out <= overhead ? 0 : max_out - overhead;
}